

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  Result RVar4;
  pointer *__ptr;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var5;
  __off64_t *in_R8;
  size_t in_R9;
  Expr *in_stack_ffffffffffffff08;
  Expr *pEVar6;
  allocator local_e9;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ExprList cond;
  undefined8 uStack_b0;
  undefined1 local_a8 [32];
  intrusive_list<wabt::Expr> *local_88;
  _Head_base<0UL,_wabt::Expr_*,_false> local_80;
  _Head_base<0UL,_wabt::Expr_*,_false> local_78;
  _Head_base<0UL,_wabt::Expr_*,_false> local_70;
  _Head_base<0UL,_wabt::Expr_*,_false> local_68;
  _Head_base<0UL,_wabt::Expr_*,_false> local_60;
  Location loc;
  
  bVar1 = PeekMatch(this,Lpar);
  RVar4.enum_ = Error;
  if (!bVar1) {
    return (Result)Error;
  }
  TVar2 = Peek(this,1);
  if ((TVar2 - AtomicLoad < 0x3e) &&
     ((0x37ff7effbd9fbf7fU >> ((ulong)(TVar2 - AtomicLoad) & 0x3f) & 1) != 0)) {
    Consume((Token *)&cond,this);
    local_e8._M_head_impl = (Expr *)0x0;
    RVar3 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_e8);
    if ((RVar3.enum_ == Error) || (RVar3 = ParseExprList(this,exprs), RVar3.enum_ == Error)) {
      bVar1 = false;
    }
    else {
      local_88 = exprs;
      std::__cxx11::string::string((string *)&cond,"an expr",(allocator *)&stack0xffffffffffffff08);
      loc.filename.data_ = (char *)0x0;
      loc.filename.size_ = 0;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&loc,&cond,
                 local_a8);
      bVar1 = false;
      RVar3 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&loc,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&loc);
      std::__cxx11::string::_M_dispose();
      if (RVar3.enum_ != Error) {
        local_60._M_head_impl = local_e8._M_head_impl;
        local_e8._M_head_impl = (Expr *)0x0;
        intrusive_list<wabt::Expr>::push_back
                  (local_88,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_60);
        if (local_60._M_head_impl != (Expr *)0x0) {
          (*(local_60._M_head_impl)->_vptr_Expr[1])();
        }
        local_60._M_head_impl = (Expr *)0x0;
        bVar1 = true;
      }
    }
    if (local_e8._M_head_impl != (Expr *)0x0) {
      (*(local_e8._M_head_impl)->_vptr_Expr[1])();
    }
joined_r0x00236e8b:
    if (!bVar1) {
      return (Result)RVar4.enum_;
    }
  }
  else {
    GetLocation(&loc,this);
    TVar2 = Peek(this,1);
    if (TVar2 == Try) {
      Consume((Token *)&cond,this);
      Consume((Token *)&cond,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)&cond);
      MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)&local_e8,&loc);
      RVar4 = ParseLabelOpt(this,(string *)(local_e8._M_head_impl + 1));
      if (((RVar4.enum_ != Error) &&
          (RVar4 = ParseBlockDeclaration
                             (this,(BlockDeclaration *)&local_e8._M_head_impl[1].loc.filename.size_)
          , RVar4.enum_ != Error)) &&
         (RVar4 = ParseInstrList(this,(ExprList *)&local_e8._M_head_impl[3].loc.filename.size_),
         RVar4.enum_ != Error)) {
        GetLocation((Location *)&cond,this);
        local_e8._M_head_impl[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)cond.size_;
        local_e8._M_head_impl[4].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)uStack_b0;
        *(Expr **)&local_e8._M_head_impl[3].type_ = cond.first_;
        local_e8._M_head_impl[4]._vptr_Expr = (_func_int **)cond.last_;
        RVar4 = Expect(this,Lpar);
        if (((RVar4.enum_ != Error) && (RVar4 = Expect(this,Catch), RVar4.enum_ != Error)) &&
           ((RVar4 = ParseTerminatingInstrList(this,(ExprList *)&local_e8._M_head_impl[4].loc),
            RVar4.enum_ != Error &&
            (RVar4 = Expect(this,Rpar), _Var5._M_head_impl = local_e8._M_head_impl,
            RVar4.enum_ != Error)))) {
          local_e8._M_head_impl = (Expr *)0x0;
          local_80._M_head_impl = _Var5._M_head_impl;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_80);
          if (local_80._M_head_impl != (Expr *)0x0) {
            (*(local_80._M_head_impl)->_vptr_Expr[1])();
          }
          local_80._M_head_impl = (Expr *)0x0;
          bVar1 = true;
          _Var5._M_head_impl = local_e8._M_head_impl;
          goto LAB_00236ed6;
        }
      }
      bVar1 = false;
      _Var5._M_head_impl = local_e8._M_head_impl;
    }
    else {
      if (TVar2 == If) {
        Consume((Token *)&cond,this);
        Consume((Token *)&cond,this);
        MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&stack0xffffffffffffff08,&loc);
        RVar3 = ParseLabelOpt(this,(string *)(in_stack_ffffffffffffff08 + 1));
        RVar4.enum_ = Error;
        if ((RVar3.enum_ == Error) ||
           (RVar3 = ParseBlockDeclaration
                              (this,(BlockDeclaration *)
                                    &in_stack_ffffffffffffff08[1].loc.filename.size_),
           RVar3.enum_ == Error)) {
LAB_00236e76:
          bVar1 = false;
          pEVar6 = in_stack_ffffffffffffff08;
        }
        else {
          bVar1 = PeekMatchExpr(this);
          if (bVar1) {
            cond.first_ = (Expr *)0x0;
            cond.last_ = (Expr *)0x0;
            cond.size_ = 0;
            RVar3 = ParseExpr(this,&cond);
            if (RVar3.enum_ == Error) {
              intrusive_list<wabt::Expr>::clear(&cond);
              goto LAB_00236e76;
            }
            intrusive_list<wabt::Expr>::splice
                      (exprs,(int)exprs,(__off64_t *)0x0,(int)&cond,in_R8,in_R9,
                       (uint)in_stack_ffffffffffffff08);
            intrusive_list<wabt::Expr>::clear(&cond);
          }
          bVar1 = MatchLpar(this,Then);
          if (!bVar1) {
            bVar1 = PeekMatchExpr(this);
            if (bVar1) {
              RVar3 = ParseExpr(this,(ExprList *)&in_stack_ffffffffffffff08[3].loc.filename.size_);
              if (RVar3.enum_ != Error) {
                GetLocation((Location *)&cond,this);
                in_stack_ffffffffffffff08[4].super_intrusive_list_base<wabt::Expr>.next_ =
                     (Expr *)cond.size_;
                in_stack_ffffffffffffff08[4].super_intrusive_list_base<wabt::Expr>.prev_ =
                     (Expr *)uStack_b0;
                *(Expr **)&in_stack_ffffffffffffff08[3].type_ = cond.first_;
                in_stack_ffffffffffffff08[4]._vptr_Expr = (_func_int **)cond.last_;
                bVar1 = PeekMatchExpr(this);
                if (!bVar1) goto LAB_0023711d;
LAB_002370e1:
                RVar3 = ParseExpr(this,(ExprList *)&in_stack_ffffffffffffff08[4].loc);
LAB_002370e9:
                if (RVar3.enum_ != Error) goto LAB_002370f2;
              }
            }
            else {
              ConsumeIfLpar(this);
              std::__cxx11::string::string((string *)&cond,"then block",&local_e9);
              local_e8._M_head_impl = (Expr *)0x0;
              uStack_e0 = 0;
              local_d8 = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_initialize<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_e8,&cond,local_a8);
              RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&local_e8,"(then ...)");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_e8);
              std::__cxx11::string::_M_dispose();
            }
            goto LAB_00236e76;
          }
          RVar3 = ParseTerminatingInstrList
                            (this,(ExprList *)&in_stack_ffffffffffffff08[3].loc.filename.size_);
          if (RVar3.enum_ == Error) goto LAB_00236e76;
          GetLocation((Location *)&cond,this);
          in_stack_ffffffffffffff08[4].super_intrusive_list_base<wabt::Expr>.next_ =
               (Expr *)cond.size_;
          in_stack_ffffffffffffff08[4].super_intrusive_list_base<wabt::Expr>.prev_ =
               (Expr *)uStack_b0;
          *(Expr **)&in_stack_ffffffffffffff08[3].type_ = cond.first_;
          in_stack_ffffffffffffff08[4]._vptr_Expr = (_func_int **)cond.last_;
          RVar3 = Expect(this,Rpar);
          if (RVar3.enum_ == Error) goto LAB_00236e76;
          bVar1 = MatchLpar(this,Else);
          if (bVar1) {
            RVar3 = ParseTerminatingInstrList(this,(ExprList *)&in_stack_ffffffffffffff08[4].loc);
            if (RVar3.enum_ != Error) {
              RVar3 = Expect(this,Rpar);
              goto LAB_002370e9;
            }
            goto LAB_00236e76;
          }
          bVar1 = PeekMatchExpr(this);
          if (bVar1) goto LAB_002370e1;
LAB_002370f2:
          GetLocation((Location *)&cond,this);
          in_stack_ffffffffffffff08[5]._vptr_Expr = (_func_int **)cond.size_;
          in_stack_ffffffffffffff08[5].super_intrusive_list_base<wabt::Expr>.next_ =
               (Expr *)uStack_b0;
          *(Expr **)((long)&in_stack_ffffffffffffff08[4].loc.field_1 + 8) = cond.first_;
          *(Expr **)&in_stack_ffffffffffffff08[4].type_ = cond.last_;
LAB_0023711d:
          pEVar6 = (Expr *)0x0;
          local_78._M_head_impl = in_stack_ffffffffffffff08;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_78);
          if (local_78._M_head_impl != (Expr *)0x0) {
            (*(local_78._M_head_impl)->_vptr_Expr[1])();
          }
          local_78._M_head_impl = (Expr *)0x0;
          bVar1 = true;
        }
        if (pEVar6 != (Expr *)0x0) {
          (*pEVar6->_vptr_Expr[1])();
        }
        goto joined_r0x00236e8b;
      }
      if (TVar2 == Loop) {
        Consume((Token *)&cond,this);
        Consume((Token *)&cond,this);
        MakeUnique<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Location&>((wabt *)&cond,&loc);
        RVar4 = ParseLabelOpt(this,(string *)(cond.first_ + 1));
        if ((RVar4.enum_ == Error) ||
           (RVar4 = ParseBlock(this,(Block *)(cond.first_ + 1)), pEVar6 = cond.first_,
           RVar4.enum_ == Error)) goto LAB_00236d0d;
        cond.first_ = (Expr *)0x0;
        local_70._M_head_impl = pEVar6;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_70);
        if (local_70._M_head_impl != (Expr *)0x0) {
          (*(local_70._M_head_impl)->_vptr_Expr[1])();
        }
        local_70._M_head_impl = (Expr *)0x0;
      }
      else {
        if (TVar2 != Block) {
          __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                        ,0xa5e,"Result wabt::WastParser::ParseExpr(ExprList *)");
        }
        Consume((Token *)&cond,this);
        Consume((Token *)&cond,this);
        MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>((wabt *)&cond,&loc);
        RVar4 = ParseLabelOpt(this,(string *)(cond.first_ + 1));
        if ((RVar4.enum_ == Error) ||
           (RVar4 = ParseBlock(this,(Block *)(cond.first_ + 1)), pEVar6 = cond.first_,
           RVar4.enum_ == Error)) {
LAB_00236d0d:
          bVar1 = false;
          _Var5._M_head_impl = cond.first_;
          goto LAB_00236ed6;
        }
        cond.first_ = (Expr *)0x0;
        local_68._M_head_impl = pEVar6;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_68);
        if (local_68._M_head_impl != (Expr *)0x0) {
          (*(local_68._M_head_impl)->_vptr_Expr[1])();
        }
        local_68._M_head_impl = (Expr *)0x0;
      }
      bVar1 = true;
      _Var5._M_head_impl = cond.first_;
    }
LAB_00236ed6:
    if (_Var5._M_head_impl != (Expr *)0x0) {
      (*(_Var5._M_head_impl)->_vptr_Expr[1])();
    }
    if (!bVar1) {
      return (Result)Error;
    }
  }
  RVar4 = Expect(this,Rpar);
  return (Result)(uint)(RVar4.enum_ == Error);
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = MakeUnique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = MakeUnique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = MakeUnique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = MakeUnique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        EXPECT(Lpar);
        EXPECT(Catch);
        CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
        EXPECT(Rpar);
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}